

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gen.pvip.y.c
# Opt level: O3

void yy_1_package_stmt(GREG *G,char *yytext,int yyleng,yythunk *thunk,PVIPParserContext yyxvar)

{
  PVIPNode *pPVar1;
  
  pPVar1 = PVIP_node_new_children2(&G->data,PVIP_NODE_PACKAGE,G->val[-2],G->val[-1]);
  G->ss = pPVar1;
  return;
}

Assistant:

YY_ACTION(void) yy_1_package_stmt(GREG *G, char *yytext, int yyleng, yythunk *thunk, YY_XTYPE YY_XVAR)
{
#define blk G->val[-1]
#define pkg G->val[-2]
  yyprintf((stderr, "do yy_1_package_stmt"));
  yyprintfvTcontext(yytext);
  yyprintf((stderr, "\n  {\n\
        yy = CHILDREN2(PVIP_NODE_PACKAGE, pkg, blk);\n\
    }\n"));
  
        yy = CHILDREN2(PVIP_NODE_PACKAGE, pkg, blk);
    ;
#undef blk
#undef pkg
}